

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
alternate_matcher<boost::xpressive::detail::alternates_vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (alternate_matcher<boost::xpressive::detail::alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  bool bVar1;
  reference pcVar2;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char_type in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  char cVar3;
  
  bVar1 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::eos((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  if (!bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&in_RSI->cur_);
    cVar3 = *pcVar2;
    traits_cast<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x17cfc5);
    bVar1 = alternate_matcher<boost::xpressive::detail::alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
            ::can_match_((alternate_matcher<boost::xpressive::detail::alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                          *)CONCAT17(cVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf,
                         (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)0x17cfd9);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = alt_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                    (in_RDI,in_RSI,in_RDX);
  return bVar1;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            if(!state.eos() && !this->can_match_(*state.cur_, traits_cast<Traits>(state)))
            {
                return false;
            }

            return detail::alt_match(this->alternates_, state, next);
        }